

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::generateBufferVariableNameLengthCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup)

{
  TestCaseGroup *pTVar1;
  ArrayElement *this;
  allocator<char> local_59;
  SharedPtr unsized;
  string local_48;
  
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar1,context,"sized","Sized target");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,glcts::fixed_sample_locations_values + 1,
             (allocator<char> *)&unsized);
  generateBufferBackedVariableAggregateTypeCases
            (context,parentStructure,(TestCaseGroup *)pTVar1,PROGRAMINTERFACE_BUFFER_VARIABLE,
             PROGRAMRESOURCEPROP_NAME_LENGTH,TYPE_FLOAT,&local_48,3);
  std::__cxx11::string::~string((string *)&local_48);
  this = (ArrayElement *)operator_new(0x28);
  ResourceDefinition::ArrayElement::ArrayElement(this,parentStructure,-2);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&unsized,(Node *)this);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar1,context,"unsized","Unsized target");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,glcts::fixed_sample_locations_values + 1,&local_59);
  generateBufferBackedVariableAggregateTypeCases
            (context,&unsized,(TestCaseGroup *)pTVar1,PROGRAMINTERFACE_BUFFER_VARIABLE,
             PROGRAMRESOURCEPROP_NAME_LENGTH,TYPE_FLOAT,&local_48,2);
  std::__cxx11::string::~string((string *)&local_48);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&unsized);
  return;
}

Assistant:

static void generateBufferVariableNameLengthCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup)
{
	// .sized
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "sized", "Sized target");
		targetGroup->addChild(blockGroup);

		generateBufferBackedVariableAggregateTypeCases(context, parentStructure, blockGroup, PROGRAMINTERFACE_BUFFER_VARIABLE, PROGRAMRESOURCEPROP_NAME_LENGTH, glu::TYPE_FLOAT, "", 3);
	}

	// .unsized
	{
		const ResourceDefinition::Node::SharedPtr	unsized		(new ResourceDefinition::ArrayElement(parentStructure, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
		tcu::TestCaseGroup* const					blockGroup	= new TestCaseGroup(context, "unsized", "Unsized target");
		targetGroup->addChild(blockGroup);

		generateBufferBackedVariableAggregateTypeCases(context, unsized, blockGroup, PROGRAMINTERFACE_BUFFER_VARIABLE, PROGRAMRESOURCEPROP_NAME_LENGTH, glu::TYPE_FLOAT, "", 2);
	}
}